

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumlib.hpp
# Opt level: O2

double __thiscall sumlib::rsorted<double>::get(rsorted<double> *this)

{
  double *pdVar1;
  double dVar2;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__reverse<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  dVar2 = 0.0;
  for (pdVar1 = (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != (this->xs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    dVar2 = dVar2 + *pdVar1;
  }
  return dVar2;
}

Assistant:

T get() {
            std::sort( begin(xs), end(xs) );
            std::reverse( begin(xs), end(xs) );
            return accumulate(begin(xs), end(xs), (T)0);
        }